

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::TiledOutputFile::copyPixels(TiledOutputFile *this,TiledInputFile *in)

{
  pointer *ppiVar1;
  LineOrder LVar2;
  Compression CVar3;
  LevelMode LVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Header *this_00;
  TileDescription *pTVar10;
  TileDescription *pTVar11;
  Box2i *pBVar12;
  Box2i *pBVar13;
  LineOrder *pLVar14;
  Compression *pCVar15;
  ChannelList *this_01;
  ChannelList *other;
  Data *pDVar16;
  char *pcVar17;
  ostream *poVar18;
  LogicExc *this_02;
  ArgExc *pAVar19;
  LevelRoundingMode LVar20;
  int i_l;
  size_type __n;
  ulong uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  TileCoord TVar26;
  int ly;
  int lx;
  int dy;
  int dx;
  int pixelDataSize;
  pthread_mutex_t *local_218;
  char *pixelData;
  vector<int,_std::allocator<int>_> ly_table;
  vector<int,_std::allocator<int>_> lx_table;
  vector<int,_std::allocator<int>_> dy_table;
  vector<int,_std::allocator<int>_> dx_table;
  
  local_218 = (pthread_mutex_t *)this->_streamData;
  iVar6 = pthread_mutex_lock(local_218);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pDVar16 = this->_data;
  this_00 = TiledInputFile::header(in);
  bVar5 = Header::hasTileDescription(&pDVar16->header);
  if ((!bVar5) || (bVar5 = Header::hasTileDescription(this_00), !bVar5)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Cannot perform a quick pixel copy from image file \"",0x33);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,
               "\".  The output file is tiled, but the input file is not.  Try using OutputFile::copyPixels() instead."
               ,0x65);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pTVar10 = Header::tileDescription(&pDVar16->header);
  pTVar11 = Header::tileDescription(this_00);
  if ((pTVar10->xSize != pTVar11->xSize) ||
     (((pTVar10->ySize != pTVar11->ySize || (pTVar10->mode != pTVar11->mode)) ||
      (LVar20 = pTVar10->roundingMode, LVar20 != pTVar11->roundingMode)))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed. The files have different tile descriptions.",0x35);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pBVar12 = Header::dataWindow(&pDVar16->header);
  pBVar13 = Header::dataWindow(this_00);
  iVar6 = -(uint)((pBVar13->min).x == (pBVar12->min).x);
  iVar25 = -(uint)((pBVar13->min).y == (pBVar12->min).y);
  auVar23._4_4_ = iVar6;
  auVar23._0_4_ = iVar6;
  auVar23._8_4_ = iVar25;
  auVar23._12_4_ = iVar25;
  iVar6 = movmskpd(LVar20,auVar23);
  if ((iVar6 != 3) ||
     (iVar6 = -(uint)((pBVar13->max).x == (pBVar12->max).x),
     iVar25 = -(uint)((pBVar13->max).y == (pBVar12->max).y), auVar24._4_4_ = iVar6,
     auVar24._0_4_ = iVar6, auVar24._8_4_ = iVar25, auVar24._12_4_ = iVar25,
     iVar6 = movmskpd((int)pBVar13,auVar24), iVar6 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Cannot copy pixels from image file \"",0x24);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\". The files have different data windows.",0x29);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pLVar14 = Header::lineOrder(&pDVar16->header);
  LVar2 = *pLVar14;
  pLVar14 = Header::lineOrder(this_00);
  if (LVar2 != *pLVar14) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed. The files have different line orders.",0x2f);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pCVar15 = Header::compression(&pDVar16->header);
  CVar3 = *pCVar15;
  pCVar15 = Header::compression(this_00);
  if (CVar3 != *pCVar15) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed. The files use different compression methods.",0x36);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  this_01 = Header::channels(&pDVar16->header);
  other = Header::channels(this_00);
  bVar5 = ChannelList::operator==(this_01,other);
  if (!bVar5) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed.  The files have different channel lists.",0x32);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  bVar5 = TileOffsets::isEmpty(&this->_data->tileOffsets);
  if (!bVar5) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" failed. \"",0xb);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_02,(stringstream *)&dx_table);
    __cxa_throw(this_02,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pDVar16 = this->_data;
  LVar4 = (pDVar16->tileDesc).mode;
  if (LVar4 < RIPMAP_LEVELS) {
    uVar22 = 0;
    for (iVar6 = 0; iVar25 = numLevels(this), iVar6 < iVar25; iVar6 = iVar6 + 1) {
      iVar25 = numXTiles(this,iVar6);
      iVar7 = numYTiles(this,iVar6);
      uVar22 = uVar22 + iVar7 * iVar25;
    }
    pDVar16 = this->_data;
  }
  else {
    if (LVar4 != RIPMAP_LEVELS) {
      pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar19,"Unknown LevelMode format.");
      __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    if (pDVar16->numYLevels < 1) {
      uVar22 = 0;
    }
    else {
      uVar22 = 0;
      iVar6 = 0;
      do {
        if (0 < pDVar16->numXLevels) {
          iVar25 = 0;
          do {
            iVar7 = numXTiles(this,iVar25);
            iVar8 = numYTiles(this,iVar6);
            uVar22 = uVar22 + iVar8 * iVar7;
            iVar25 = iVar25 + 1;
            pDVar16 = this->_data;
          } while (iVar25 < pDVar16->numXLevels);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < pDVar16->numYLevels);
    }
  }
  LVar2 = pDVar16->lineOrder;
  uVar9 = 1;
  if (LVar2 == RANDOM_Y) {
    uVar9 = uVar22;
  }
  __n = (size_type)(int)uVar9;
  std::vector<int,_std::allocator<int>_>::vector(&dx_table,__n,(allocator_type *)&dy_table);
  std::vector<int,_std::allocator<int>_>::vector(&dy_table,__n,(allocator_type *)&lx_table);
  std::vector<int,_std::allocator<int>_>::vector(&lx_table,__n,(allocator_type *)&ly_table);
  std::vector<int,_std::allocator<int>_>::vector(&ly_table,__n,(allocator_type *)&pixelData);
  if (LVar2 == RANDOM_Y) {
    TiledInputFile::tileOrder
              (in,dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
               dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    pDVar16 = this->_data;
    (pDVar16->nextTileToWrite).dx =
         *dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar16->nextTileToWrite).dy =
         *dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar16->nextTileToWrite).lx =
         *lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar16->nextTileToWrite).ly =
         *ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  if (0 < (int)uVar22) {
    uVar21 = 0;
    do {
      pDVar16 = this->_data;
      dx = (pDVar16->nextTileToWrite).dx;
      dy = (pDVar16->nextTileToWrite).dy;
      lx = (pDVar16->nextTileToWrite).lx;
      ly = (pDVar16->nextTileToWrite).ly;
      TiledInputFile::rawTileData(in,&dx,&dy,&lx,&ly,&pixelData,&pixelDataSize);
      anon_unknown_6::writeTileData
                (this->_streamData,this->_data,dx,dy,lx,ly,pixelData,pixelDataSize);
      if (LVar2 == RANDOM_Y) {
        if (uVar21 < uVar22 - 1) {
          pDVar16 = this->_data;
          (pDVar16->nextTileToWrite).dx =
               dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
          (pDVar16->nextTileToWrite).dy =
               dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
          (pDVar16->nextTileToWrite).lx =
               lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
          (pDVar16->nextTileToWrite).ly =
               ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
        }
      }
      else {
        TVar26 = Data::nextTileCoord(this->_data,*(TileCoord **)&this->_data->nextTileToWrite);
        this->_data->nextTileToWrite = TVar26;
      }
      uVar21 = uVar21 + 1;
    } while (uVar22 != uVar21);
  }
  if (ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(local_218);
  return;
}

Assistant:

void	
TiledOutputFile::copyPixels (TiledInputFile &in)
{
    Lock lock (*_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header(); 

    if (!hdr.hasTileDescription() || !inHdr.hasTileDescription())
        THROW (IEX_NAMESPACE::ArgExc, "Cannot perform a quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\".  The "
                            "output file is tiled, but the input file is not.  "
                            "Try using OutputFile::copyPixels() instead.");

    if (!(hdr.tileDescription() == inHdr.tileDescription()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different tile descriptions.");

    if (!(hdr.dataWindow() == inHdr.dataWindow()))
        THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". The "
                            "files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			     "file \"" << in.fileName() << "\" to image "
			     "file \"" << fileName() << "\" "
                             "failed.  The files have different channel "
                             "lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty())
        THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
			      "file \"" << in.fileName() << "\" to image "
			      "file \"" << _streamData->os->fileName() << "\" "
                              "failed. \"" << fileName() << "\" "
                              "already contains pixel data.");

    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
      case ONE_LEVEL:
      case MIPMAP_LEVELS:

        for (int i_l = 0; i_l < numLevels (); ++i_l)
            numAllTiles += numXTiles (i_l) * numYTiles (i_l);

        break;

      case RIPMAP_LEVELS:

        for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
            for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

        break;

      default:

        throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

     bool random_y = _data->lineOrder==RANDOM_Y;

    std::vector<int> dx_table(random_y ? numAllTiles : 1);
    std::vector<int> dy_table(random_y ? numAllTiles : 1);
    std::vector<int> lx_table(random_y ? numAllTiles : 1);
    std::vector<int> ly_table(random_y ? numAllTiles : 1);
    
    if(random_y)
    {
        in.tileOrder(&dx_table[0],&dy_table[0],&lx_table[0],&ly_table[0]);
        _data->nextTileToWrite.dx=dx_table[0];
        _data->nextTileToWrite.dy=dy_table[0];
        _data->nextTileToWrite.lx=lx_table[0];
        _data->nextTileToWrite.ly=ly_table[0];
    }

    for (int i = 0; i < numAllTiles; ++i)
    {
        const char *pixelData;
        int pixelDataSize;
        
        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        
        in.rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
        writeTileData (_streamData, _data, dx, dy, lx, ly, pixelData, pixelDataSize);
        
        if(random_y)
        {
            if(i<numAllTiles-1)
            {
               _data->nextTileToWrite.dx=dx_table[i+1];
               _data->nextTileToWrite.dy=dy_table[i+1];
               _data->nextTileToWrite.lx=lx_table[i+1];
               _data->nextTileToWrite.ly=ly_table[i+1];
            }
        }else{
            _data->nextTileToWrite=_data->nextTileCoord(_data->nextTileToWrite);
        }
    }
}